

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageConfirmable_SeparateAck_Test::TestBody
          (CoapTest_CoapMessageConfirmable_SeparateAck_Test *this)

{
  char *pcVar1;
  allocator local_811;
  AssertionResult gtest_ar_2;
  event_base *eventBase;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  ErrorCode local_7ac;
  Address localhost;
  Message request;
  _Any_data local_708;
  code *local_6f8;
  code *local_6f0;
  _Any_data local_6e8;
  code *local_6d8;
  code *local_6d0;
  MockEndpoint peer0;
  Coap coap1;
  Coap coap0;
  MockEndpoint peer1;
  
  localhost.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  localhost.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  localhost.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&coap1,"127.0.0.1",(allocator *)&request);
  Address::Set((Error *)&coap0,&localhost,(string *)&coap1);
  peer1.super_Endpoint._vptr_Endpoint._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&peer0,"localhost.Set(\"127.0.0.1\")","ErrorCode::kNone",(Error *)&coap0,
             (ErrorCode *)&peer1);
  std::__cxx11::string::~string((string *)&coap0.mMessageId);
  std::__cxx11::string::~string((string *)&coap1);
  if ((char)peer0.super_Endpoint._vptr_Endpoint == '\0') {
    testing::Message::Message((Message *)&coap0);
    if (peer0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object ==
        (void *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *peer0.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&coap1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1ab,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&coap1,(Message *)&coap0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&coap1);
    if ((long *)CONCAT71(coap0._vptr_Coap._1_7_,(char)coap0._vptr_Coap) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(coap0._vptr_Coap._1_7_,(char)coap0._vptr_Coap) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&peer0.super_Endpoint.mReceiver);
  eventBase = event_base_new();
  coap1._vptr_Coap = (_func_int **)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)&coap0,"eventBase","nullptr",&eventBase,&coap1._vptr_Coap);
  if ((char)coap0._vptr_Coap == '\0') {
    testing::Message::Message((Message *)&coap1);
    if (coap0._8_8_ == 0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)coap0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&peer0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1ae,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&peer0,(Message *)&coap1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&peer0);
    if (coap1._vptr_Coap != (_func_int **)0x0) {
      (**(code **)(*coap1._vptr_Coap + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&coap0.mMessageId);
  MockEndpoint::MockEndpoint(&peer0,eventBase,&localhost,0x1633);
  MockEndpoint::MockEndpoint(&peer1,eventBase,&localhost,0x1634);
  peer0.mPeer = &peer1;
  peer1.mPeer = &peer0;
  Coap::Coap(&coap0,eventBase,&peer0.super_Endpoint);
  Coap::Coap(&coap1,eventBase,&peer1.super_Endpoint);
  std::__cxx11::string::string((string *)&gtest_ar_4,"/hello",&local_811);
  local_6e8._8_8_ = 0;
  local_6d0 = std::
              _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:440:5)>
              ::_M_invoke;
  local_6d8 = std::
              _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:440:5)>
              ::_M_manager;
  local_6e8._M_unused._M_object = &coap1;
  Resource::Resource((Resource *)&request,(string *)&gtest_ar_4,(RequestHandler *)&local_6e8);
  Coap::AddResource((Error *)&gtest_ar_5,&coap1,(Resource *)&request);
  local_7ac = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_2,
             "coap1.AddResource({\"/hello\", [&coap1](const Request &aRequest) { switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar_ = ::testing::AssertionResult(aRequest.IsRequest())) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 442, ::testing::internal::GetBoolAssertionFailureMessage( gtest_ar_, \"aRequest.IsRequest()\", \"false\", \"true\").c_str()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetType()\", \"Type::kConfirmable\", aRequest.GetType(), Type::kConfirmable))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 443, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetCode()\", \"Code::kGet\", aRequest.GetCode(), Code::kGet))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 444, gtest_ar.failure_message()) = ::testing::Message(); ContentFormat contentFormat; switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetContentFormat(contentFormat)\", \"ErrorCode::kNone\", aRequest.GetContentFormat(contentFormat), ErrorCode::kNone))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 447, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper:..." /* TRUNCATED STRING LITERAL */
             ,"ErrorCode::kNone",(Error *)&gtest_ar_5,&local_7ac);
  std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
  Resource::~Resource((Resource *)&request);
  std::_Function_base::~_Function_base((_Function_base *)&local_6e8);
  std::__cxx11::string::~string((string *)&gtest_ar_4);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&request);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1cf,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&request);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (request.mHeader._0_8_ != 0) {
      (**(code **)(*(long *)request.mHeader._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  Message::Message(&request,kConfirmable,kGet);
  std::__cxx11::string::string((string *)&gtest_ar_4,"/hello",&local_811);
  Message::SetUriPath((Error *)&gtest_ar_5,&request,(string *)&gtest_ar_4);
  local_7ac = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_2,"request.SetUriPath(\"/hello\")","ErrorCode::kNone",
             (Error *)&gtest_ar_5,&local_7ac);
  std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_4);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1d2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if ((long *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  Message::SetContentFormat((Error *)&gtest_ar_5,&request,kTextPlain);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_4,"request.SetContentFormat(ContentFormat::kTextPlain)",
             "ErrorCode::kNone",(Error *)&gtest_ar_5,(ErrorCode *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1d3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  std::__cxx11::string::string((string *)&gtest_ar_5,"hello, CoAP",(allocator *)&gtest_ar_4);
  Message::Append(&request,(string *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  local_708._8_8_ = 0;
  local_6f0 = std::
              _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:470:32)>
              ::_M_invoke;
  local_6f8 = std::
              _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp:470:32)>
              ::_M_manager;
  local_708._M_unused._M_object = &eventBase;
  Coap::SendRequest(&coap0,&request,(ResponseHandler *)&local_708);
  std::_Function_base::~_Function_base((_Function_base *)&local_708);
  gtest_ar_4._0_4_ = event_base_loop(eventBase,4);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"event_base_loop(eventBase, 0x04)","0",(int *)&gtest_ar_4,
             (int *)&gtest_ar_2);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1e4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  event_base_free(eventBase);
  Message::~Message(&request);
  Coap::~Coap(&coap1);
  Coap::~Coap(&coap0);
  MockEndpoint::~MockEndpoint(&peer1);
  MockEndpoint::~MockEndpoint(&peer0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&localhost);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_ValidVersion)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetVersion(), kVersion1);
    EXPECT_EQ(message->GetType(), Type::kConfirmable);
    EXPECT_EQ(message->GetToken().size(), 0);
    EXPECT_EQ(message->GetCode(), utils::from_underlying<Code>(0));
    EXPECT_EQ(message->GetMessageId(), 0);
}